

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.hpp
# Opt level: O0

string * __thiscall
beast::unit_test::detail::reporter<void>::fmtdur_abi_cxx11_
          (string *__return_storage_ptr__,reporter<void> *this,duration *d)

{
  bool bVar1;
  _Setprecision _Var2;
  ostream *poVar3;
  rep rVar4;
  stringstream local_1f0 [8];
  stringstream ss;
  undefined1 local_1e0 [392];
  rep local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  duration<long,_std::ratio<1L,_1L>_> local_28;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> ms;
  duration *d_local;
  
  ms.__r = (rep)this;
  local_20.__r = (rep)::std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)this);
  local_2c = 1;
  ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_28,&local_2c);
  bVar1 = ::std::chrono::operator<(&local_20,&local_28);
  if (bVar1) {
    local_58 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_20);
    boost::lexical_cast<std::__cxx11::string,long>((boost *)&local_50,&local_58);
    ::std::operator+(__return_storage_ptr__,&local_50,"ms");
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    ::std::__cxx11::stringstream::stringstream(local_1f0);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1e0,std::fixed);
    _Var2 = std::setprecision(1);
    poVar3 = ::std::operator<<(poVar3,_Var2);
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_20);
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,(double)rVar4 / 1000.0);
    ::std::operator<<(poVar3,"s");
    ::std::__cxx11::stringstream::str();
    ::std::__cxx11::stringstream::~stringstream(local_1f0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
reporter<_>::fmtdur(typename clock_type::duration const& d)
{
    using namespace std::chrono;
    auto const ms = duration_cast<milliseconds>(d);
    if(ms < seconds{1})
        return boost::lexical_cast<std::string>(
            ms.count()) + "ms";
    std::stringstream ss;
    ss << std::fixed << std::setprecision(1) <<
       (ms.count()/1000.) << "s";
    return ss.str();
}